

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall TiXmlDocument::LoadFile(TiXmlDocument *this,FILE *file,TiXmlEncoding encoding)

{
  char *pcVar1;
  bool bVar2;
  size_t __size;
  char *__ptr;
  size_t sVar3;
  ulong uVar4;
  char LF;
  char *pcStack_48;
  char CR;
  char *q;
  char *p;
  char *buf;
  long length;
  TiXmlEncoding encoding_local;
  FILE *file_local;
  TiXmlDocument *this_local;
  
  if (file == (FILE *)0x0) {
    SetError(this,2,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
    this_local._7_1_ = false;
  }
  else {
    TiXmlNode::Clear(&this->super_TiXmlNode);
    TiXmlCursor::Clear(&(this->super_TiXmlNode).super_TiXmlBase.location);
    fseek((FILE *)file,0,2);
    __size = ftell((FILE *)file);
    fseek((FILE *)file,0,0);
    if ((long)__size < 1) {
      SetError(this,0xc,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
      this_local._7_1_ = false;
    }
    else {
      uVar4 = __size + 1;
      if ((long)uVar4 < 0) {
        uVar4 = 0xffffffffffffffff;
      }
      __ptr = (char *)operator_new__(uVar4);
      *__ptr = '\0';
      sVar3 = fread(__ptr,__size,1,(FILE *)file);
      if (sVar3 == 1) {
        __ptr[__size] = '\0';
        pcStack_48 = __ptr;
        q = __ptr;
        while (*q != '\0') {
          if (__ptr + __size <= q) {
            __assert_fail("p < (buf+length)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                          ,0x423,"bool TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)");
          }
          if (__ptr + __size < pcStack_48) {
            __assert_fail("q <= (buf+length)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                          ,0x424,"bool TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)");
          }
          if (q < pcStack_48) {
            __assert_fail("q <= p",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                          ,0x425,"bool TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)");
          }
          if (*q == '\r') {
            *pcStack_48 = '\n';
            pcVar1 = q + 1;
            if (q[1] == '\n') {
              pcVar1 = q + 2;
            }
          }
          else {
            *pcStack_48 = *q;
            pcVar1 = q + 1;
          }
          q = pcVar1;
          pcStack_48 = pcStack_48 + 1;
        }
        if (__ptr + __size < pcStack_48) {
          __assert_fail("q <= (buf+length)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                        ,0x432,"bool TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)");
        }
        *pcStack_48 = '\0';
        (*(this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[3])(this,__ptr,0,(ulong)encoding);
        if (__ptr != (char *)0x0) {
          operator_delete__(__ptr);
        }
        bVar2 = Error(this);
        this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
      }
      else {
        if (__ptr != (char *)0x0) {
          operator_delete__(__ptr);
        }
        SetError(this,2,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TiXmlDocument::LoadFile( FILE* file, TiXmlEncoding encoding )
{
	if ( !file ) 
	{
		SetError( TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN );
		return false;
	}

	// Delete the existing data:
	Clear();
	location.Clear();

	// Get the file size, so we can pre-allocate the string. HUGE speed impact.
	long length = 0;
	fseek( file, 0, SEEK_END );
	length = ftell( file );
	fseek( file, 0, SEEK_SET );

	// Strange case, but good to handle up front.
	if ( length <= 0 )
	{
		SetError( TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return false;
	}

	// Subtle bug here. TinyXml did use fgets. But from the XML spec:
	// 2.11 End-of-Line Handling
	// <snip>
	// <quote>
	// ...the XML processor MUST behave as if it normalized all line breaks in external 
	// parsed entities (including the document entity) on input, before parsing, by translating 
	// both the two-character sequence #xD #xA and any #xD that is not followed by #xA to 
	// a single #xA character.
	// </quote>
	//
	// It is not clear fgets does that, and certainly isn't clear it works cross platform. 
	// Generally, you expect fgets to translate from the convention of the OS to the c/unix
	// convention, and not work generally.

	/*
	while( fgets( buf, sizeof(buf), file ) )
	{
		data += buf;
	}
	*/

	char* buf = new char[ length+1 ];
	buf[0] = 0;

	if ( fread( buf, length, 1, file ) != 1 ) {
		delete [] buf;
		SetError( TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN );
		return false;
	}

	// Process the buffer in place to normalize new lines. (See comment above.)
	// Copies from the 'p' to 'q' pointer, where p can advance faster if
	// a newline-carriage return is hit.
	//
	// Wikipedia:
	// Systems based on ASCII or a compatible character set use either LF  (Line feed, '\n', 0x0A, 10 in decimal) or 
	// CR (Carriage return, '\r', 0x0D, 13 in decimal) individually, or CR followed by LF (CR+LF, 0x0D 0x0A)...
	//		* LF:    Multics, Unix and Unix-like systems (GNU/Linux, AIX, Xenix, Mac OS X, FreeBSD, etc.), BeOS, Amiga, RISC OS, and others
    //		* CR+LF: DEC RT-11 and most other early non-Unix, non-IBM OSes, CP/M, MP/M, DOS, OS/2, Microsoft Windows, Symbian OS
    //		* CR:    Commodore 8-bit machines, Apple II family, Mac OS up to version 9 and OS-9

	const char* p = buf;	// the read head
	char* q = buf;			// the write head
	const char CR = 0x0d;
	const char LF = 0x0a;

	buf[length] = 0;
	while( *p ) {
		assert( p < (buf+length) );
		assert( q <= (buf+length) );
		assert( q <= p );

		if ( *p == CR ) {
			*q++ = LF;
			p++;
			if ( *p == LF ) {		// check for CR+LF (and skip LF)
				p++;
			}
		}
		else {
			*q++ = *p++;
		}
	}
	assert( q <= (buf+length) );
	*q = 0;

	Parse( buf, 0, encoding );

	delete [] buf;
	return !Error();
}